

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O0

void __thiscall libebml::EbmlCrc32::Finalize(EbmlCrc32 *this)

{
  EbmlCrc32 *this_local;
  
  this->m_crc = this->m_crc ^ 0xffffffff;
  this->m_crc_final = this->m_crc;
  ResetCRC(this);
  EbmlElement::SetValueIsSet((EbmlElement *)this,true);
  return;
}

Assistant:

void EbmlCrc32::Finalize()
{
  //Finalize the CRC32
  m_crc ^= CRC32_NEGL;
  //Copy it over to completed CRC32 memeber
  m_crc_final = m_crc;
  //Reset the holding CRC member (m_crc)
  ResetCRC();
  //This EbmlElement has been set
  SetValueIsSet();
}